

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O1

Value * soul::Value::createFromRawData
                  (Value *__return_storage_ptr__,Type *type,void *sourceData,size_t dataSize)

{
  size_t newSize;
  Type local_30;
  
  local_30.category = type->category;
  local_30.arrayElementCategory = type->arrayElementCategory;
  local_30.isRef = type->isRef;
  local_30.isConstant = type->isConstant;
  local_30.primitiveType.type = (type->primitiveType).type;
  local_30.boundingSize = type->boundingSize;
  local_30.arrayElementBoundingSize = type->arrayElementBoundingSize;
  local_30.structure.object = (type->structure).object;
  (type->structure).object = (Structure *)0x0;
  Value(__return_storage_ptr__,&local_30);
  RefCountedPtr<soul::Structure>::decIfNotNull(local_30.structure.object);
  newSize = (__return_storage_ptr__->allocatedData).allocatedSize;
  if (newSize == dataSize) {
    if ((__return_storage_ptr__->allocatedData).allocatedData.numActive == 0) {
      ArrayWithPreallocation<unsigned_char,_8UL>::resize
                (&(__return_storage_ptr__->allocatedData).allocatedData,newSize);
    }
    memcpy((__return_storage_ptr__->allocatedData).allocatedData.items,sourceData,
           (__return_storage_ptr__->allocatedData).allocatedSize);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("dataSize == v.getPackedDataSize()","createFromRawData",0x217);
}

Assistant:

Value Value::createFromRawData (Type type, const void* sourceData, size_t dataSize)
{
    ignoreUnused (dataSize);

    Value v (std::move (type));
    SOUL_ASSERT (dataSize == v.getPackedDataSize());
    memcpy (v.getPackedData(), sourceData, v.getPackedDataSize());
    return v;
}